

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QString> * __thiscall
QMap<QString,_QList<QString>_>::operator[](QMap<QString,_QList<QString>_> *this,QString *key)

{
  bool bVar1;
  QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
  *pQVar2;
  pointer ppVar3;
  value_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QList<QString>_>_>,_bool> pVar4;
  iterator i;
  QMap<QString,_QList<QString>_> copy;
  map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
  *in_stack_ffffffffffffff38;
  QList<QString> *pQVar5;
  QMap<QString,_QList<QString>_> *in_stack_ffffffffffffff40;
  map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
  *this_00;
  pair<const_QString,_QList<QString>_> *this_01;
  map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
  local_78;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff40->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff40,(QMap<QString,_QList<QString>_> *)in_stack_ffffffffffffff38);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<QString,_QList<QString>_> *)0x108b6f);
  }
  detach(in_stack_ffffffffffffff40);
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                *)0x108b92);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x108ba3);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                *)0x108bb5);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                           *)0x108bf1);
    this_01 = (pair<const_QString,_QList<QString>_> *)&pQVar2->m;
    local_78._M_t._M_impl._0_8_ = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    this_00 = &local_78;
    QList<QString>::QList((QList<QString> *)0x108c24);
    std::pair<const_QString,_QList<QString>_>::pair<QList<QString>,_true>
              (this_01,(QString *)this_00,(QList<QString> *)in_RSI);
    pVar4 = std::
            map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
            ::insert(this_00,in_RSI);
    local_28._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_28._M_node;
    std::pair<const_QString,_QList<QString>_>::~pair(in_RSI);
    QList<QString>::~QList((QList<QString> *)0x108c91);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_QString,_QList<QString>_>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QString,_QList<QString>_>_> *)0x108c9e);
  pQVar5 = &ppVar3->second;
  ~QMap((QMap<QString,_QList<QString>_> *)0x108cb3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }